

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O1

Joint * __thiscall
CMU462::DynamicScene::Skeleton::createNewJoint(Skeleton *this,Joint *parent,Vector3D *endPos)

{
  pointer *pppJVar1;
  iterator iVar2;
  double dVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Joint *this_00;
  Joint *newJoint;
  Vector4D endPos4d;
  Matrix4x4 invT;
  Matrix4x4 T;
  Joint *local_1b8;
  double local_1b0;
  double dStack_1a8;
  double local_1a0;
  Vector4D local_198;
  Vector4D local_178;
  double local_148;
  double local_140;
  double local_138;
  Matrix4x4 local_130;
  Matrix4x4 local_b0;
  
  this_00 = (Joint *)operator_new(0x160);
  Joint::Joint(this_00,this);
  this_00->parent = parent;
  local_198.x = endPos->x;
  local_198.y = endPos->y;
  local_198.z = endPos->z;
  local_198.w = 1.0;
  local_1b8 = this_00;
  (*(this_00->super_SceneObject)._vptr_SceneObject[0xb])(&local_b0,this_00);
  Matrix4x4::inv(&local_130,&local_b0);
  Matrix4x4::operator*(&local_130,&local_198);
  Vector4D::projectTo3D(&local_178);
  endPos->z = local_1a0;
  endPos->x = local_1b0;
  endPos->y = dStack_1a8;
  (local_1b8->axis).z = endPos->z;
  uVar4 = *(undefined4 *)((long)&endPos->x + 4);
  uVar5 = *(undefined4 *)&endPos->y;
  uVar6 = *(undefined4 *)((long)&endPos->y + 4);
  *(undefined4 *)&(local_1b8->axis).x = *(undefined4 *)&endPos->x;
  *(undefined4 *)((long)&(local_1b8->axis).x + 4) = uVar4;
  *(undefined4 *)&(local_1b8->axis).y = uVar5;
  *(undefined4 *)((long)&(local_1b8->axis).y + 4) = uVar6;
  (*(this->mesh->super_SceneObject)._vptr_SceneObject[4])(&local_178);
  dVar3 = local_138 * local_138 + local_148 * local_148 + local_140 * local_140;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  local_1b8->renderScale = dVar3;
  local_1b8->capsuleRadius = dVar3 * local_1b8->capsuleRadius;
  if (parent != (Joint *)0x0) {
    iVar2._M_current =
         (parent->kids).
         super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (parent->kids).
        super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<CMU462::DynamicScene::Joint*,std::allocator<CMU462::DynamicScene::Joint*>>::
      _M_realloc_insert<CMU462::DynamicScene::Joint*const&>
                ((vector<CMU462::DynamicScene::Joint*,std::allocator<CMU462::DynamicScene::Joint*>>
                  *)&parent->kids,iVar2,&local_1b8);
    }
    else {
      *iVar2._M_current = local_1b8;
      pppJVar1 = &(parent->kids).
                  super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppJVar1 = *pppJVar1 + 1;
    }
  }
  iVar2._M_current =
       (this->joints).
       super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->joints).
      super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CMU462::DynamicScene::Joint*,std::allocator<CMU462::DynamicScene::Joint*>>::
    _M_realloc_insert<CMU462::DynamicScene::Joint*const&>
              ((vector<CMU462::DynamicScene::Joint*,std::allocator<CMU462::DynamicScene::Joint*>> *)
               &this->joints,iVar2,&local_1b8);
  }
  else {
    *iVar2._M_current = local_1b8;
    pppJVar1 = &(this->joints).
                super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppJVar1 = *pppJVar1 + 1;
  }
  return local_1b8;
}

Assistant:

Joint* Skeleton::createNewJoint(Joint * parent, Vector3D endPos)
   {
     Joint* newJoint = new Joint(this);
     newJoint->parent = parent;
      // Get the endPos in joint's local coordinate frame
      Vector4D endPos4d(endPos, 1.);
      Matrix4x4 T = newJoint->getTransformation();
      Matrix4x4 invT = T.inv();
      endPos = (invT * endPos4d).projectTo3D();

      newJoint->axis = endPos;
      double meshScale = mesh->get_bbox().extent.norm();
      newJoint->renderScale = meshScale;
      newJoint->capsuleRadius *= meshScale;
      if (parent != nullptr)
        parent->kids.push_back(newJoint);
      joints.push_back(newJoint);

      return newJoint;
   }